

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O0

DataFlowState * __thiscall
slang::analysis::DataFlowAnalysis::copyState(DataFlowAnalysis *this,DataFlowState *source)

{
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *pSVar1;
  const_reference args;
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *in_RDX;
  long in_RSI;
  DataFlowState *in_RDI;
  void *in_R8;
  undefined8 in_R9;
  size_t i;
  DataFlowState *result;
  DataFlowState *pDVar2;
  DataFlowState *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *this_00;
  DataFlowState *this_01;
  IntervalMap<unsigned_long,_std::monostate,_3U> local_78;
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *local_38;
  undefined1 local_19;
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *local_18;
  
  local_19 = 0;
  this_01 = in_RDI;
  local_18 = in_RDX;
  DataFlowState::DataFlowState(in_stack_ffffffffffffff60);
  in_RDI->reachable = (bool)(local_18[1].firstElement[0x28] & 1);
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::size(local_18);
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::reserve
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)this_01,
             in_stack_ffffffffffffff68);
  local_38 = (SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)0x0;
  while (this_00 = local_38,
        pSVar1 = (SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)
                 SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::size
                           (local_18), this_00 < pSVar1) {
    pDVar2 = in_RDI;
    args = SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::operator[]
                     (local_18,(size_type)local_38);
    IntervalMap<unsigned_long,_std::monostate,_3U>::clone
              (&local_78,(__fn *)args,(void *)(in_RSI + 0x840),(int)pSVar1,in_R8,in_R9,pDVar2);
    SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>>::
    emplace_back<slang::IntervalMap<unsigned_long,std::monostate,3u>>(this_00,args);
    local_38 = (SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)
               ((long)&local_38->data_ + 1);
  }
  return this_01;
}

Assistant:

DataFlowState DataFlowAnalysis::copyState(const DataFlowState& source) {
    DataFlowState result;
    result.reachable = source.reachable;
    result.assigned.reserve(source.assigned.size());
    for (size_t i = 0; i < source.assigned.size(); i++)
        result.assigned.emplace_back(source.assigned[i].clone(bitMapAllocator));
    return result;
}